

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O2

void __thiscall PPU::spritePixel(PPU *this,uint8_t *index,uint8_t *sprite)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar1 = 0;
  bVar3 = 0;
  if ((this->PPUMASK & 0x10) != 0) {
    uVar2 = (ulong)(uint)this->spriteCount;
    if (this->spriteCount < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      uVar4 = ~(uint)this->spritePositions[uVar1] + this->cycle;
      if (uVar4 < 8) {
        uVar4 = this->spritePatterns[uVar1] >> ((char)uVar4 * -4 + 0x1cU & 0x1f);
        if ((uVar4 & 3) != 0) {
          bVar3 = (byte)uVar4 & 0xf;
          goto LAB_0010f46f;
        }
      }
    }
    uVar1 = 0;
    bVar3 = 0;
  }
LAB_0010f46f:
  *index = (uint8_t)uVar1;
  *sprite = bVar3;
  return;
}

Assistant:

void PPU::spritePixel(uint8_t &index, uint8_t &sprite) {
    if (!(PPUMASK & flagShowSprites)) {
        index = 0;
        sprite = 0;
        return;
    }
    for (int i = 0; i < spriteCount; i++) {
        int offset = (cycle - 1) - spritePositions[i];
        if (offset < 0 || offset > 7) {
            continue;
        }
        offset = 7 - offset;
        uint8_t color = uint8_t((spritePatterns[i] >> (offset * 4)) & 0x0F);
        if ((color % 4) == 0) {
            continue;
        }
        index = i;
        sprite = color;
        return;
    }
    index = 0;
    sprite = 0;
    return;
}